

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>_>
::ExportConstraint(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
                   *this,int i_con,Container *cnt)

{
  char *pcVar1;
  int iVar2;
  BasicLogger *pBVar3;
  MemoryWriter wrt;
  undefined8 local_268;
  undefined8 uStack_260;
  MemoryWriter local_258;
  
  pBVar3 = (this->super_BasicConstraintKeeper).exporter_;
  if (pBVar3 == (BasicLogger *)0x0) {
    return;
  }
  iVar2 = (*pBVar3->_vptr_BasicLogger[2])();
  if ((char)iVar2 != '\0') {
    if ((this->super_BasicConstraintKeeper).exporter_ != (BasicLogger *)0x0) {
      local_258.super_BasicWriter<char>.buffer_ = &local_258.buffer_.super_Buffer<char>;
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_00445660;
      pcVar1 = local_258.buffer_.data_;
      local_258.buffer_.super_Buffer<char>.size_ = 0;
      local_258.buffer_.super_Buffer<char>.capacity_ = 500;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
      local_258.buffer_.super_Buffer<char>.ptr_ = pcVar1;
      WriteCon2JSON(this,&local_258,i_con,cnt);
      local_268 = 0;
      uStack_260 = 0;
      fmt::BasicWriter<char>::write
                (&local_258.super_BasicWriter<char>,0x38d553,(void *)0x0,(size_t)&local_268);
      pBVar3 = (this->super_BasicConstraintKeeper).exporter_;
      if ((pBVar3 == (BasicLogger *)0x0) ||
         (iVar2 = (*pBVar3->_vptr_BasicLogger[2])(), (char)iVar2 == '\0')) {
        pBVar3 = (BasicLogger *)0x0;
      }
      else {
        pBVar3 = (this->super_BasicConstraintKeeper).exporter_;
      }
      BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar3,&local_258);
      local_258.super_BasicWriter<char>._vptr_BasicWriter =
           (_func_int **)&PTR__BasicMemoryWriter_00445660;
      local_258.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004456a8;
      if (local_258.buffer_.super_Buffer<char>.ptr_ != pcVar1) {
        operator_delete(local_258.buffer_.super_Buffer<char>.ptr_,
                        local_258.buffer_.super_Buffer<char>.capacity_);
      }
      return;
    }
    return;
  }
  return;
}

Assistant:

void ExportConstraint(int i_con, const Container& cnt) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      WriteCon2JSON(wrt, i_con, cnt);
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }